

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O3

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  void *pvVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar32;
  undefined1 auVar31 [16];
  Mat sum;
  void *local_110;
  void *local_108;
  Mat local_e8;
  Mat local_98;
  void *local_50;
  long local_48;
  long local_40;
  long local_38;
  
  uVar1 = bottom_top_blob->dims;
  if (uVar1 == 1) {
    iVar12 = bottom_top_blob->w;
    lVar16 = (long)iVar12;
    if (0 < lVar16) {
      pvVar14 = bottom_top_blob->data;
      fVar24 = -3.4028235e+38;
      lVar9 = 0;
      do {
        fVar27 = *(float *)((long)pvVar14 + lVar9 * 4);
        if (fVar24 <= fVar27) {
          fVar24 = fVar27;
        }
        lVar9 = lVar9 + 1;
      } while (lVar16 != lVar9);
      if (0 < iVar12) {
        fVar27 = 0.0;
        lVar9 = 0;
        do {
          fVar23 = expf(*(float *)((long)pvVar14 + lVar9 * 4) - fVar24);
          *(float *)((long)pvVar14 + lVar9 * 4) = fVar23;
          fVar27 = fVar27 + fVar23;
          lVar9 = lVar9 + 1;
        } while (lVar16 != lVar9);
        if (0 < iVar12) {
          lVar9 = 0;
          do {
            *(float *)((long)pvVar14 + lVar9 * 4) =
                 *(float *)((long)pvVar14 + lVar9 * 4) * (1.0 / fVar27);
            lVar9 = lVar9 + 1;
          } while (lVar16 != lVar9);
          return 0;
        }
      }
    }
LAB_00211fa7:
    iVar22 = 0;
  }
  else {
    sVar2 = bottom_top_blob->elemsize;
    iVar12 = (this->axis >> 0x1f & uVar1) + this->axis;
    if ((uVar1 == 2) && (iVar12 == 0)) {
      uVar1 = bottom_top_blob->w;
      uVar15 = (ulong)uVar1;
      uVar19 = bottom_top_blob->h;
      uVar11 = (ulong)uVar19;
      local_e8.cstep = 0;
      local_e8.data = (void *)0x0;
      local_e8.refcount._0_4_ = 0;
      local_e8.refcount._4_4_ = 0;
      local_e8.elemsize = 0;
      local_e8.elempack = 0;
      local_e8.allocator = (Allocator *)0x0;
      local_e8.dims = 0;
      local_e8.w = 0;
      local_e8.h = 0;
      local_e8.d = 0;
      local_e8.c = 0;
      Mat::create(&local_e8,uVar1,sVar2,opt->workspace_allocator);
      auVar8 = _DAT_00312280;
      auVar7 = _DAT_00312270;
      auVar6 = _DAT_00312200;
      iVar22 = -100;
      if ((local_e8.data != (void *)0x0) && (local_e8.cstep * (long)local_e8.c != 0)) {
        uVar13 = (int)local_e8.cstep * local_e8.c;
        if (0 < (int)uVar13) {
          lVar16 = (ulong)uVar13 - 1;
          auVar25._8_4_ = (int)lVar16;
          auVar25._0_8_ = lVar16;
          auVar25._12_4_ = (int)((ulong)lVar16 >> 0x20);
          uVar20 = 0;
          auVar25 = auVar25 ^ _DAT_00312200;
          do {
            auVar28._8_4_ = (int)uVar20;
            auVar28._0_8_ = uVar20;
            auVar28._12_4_ = (int)(uVar20 >> 0x20);
            auVar31 = (auVar28 | auVar8) ^ auVar6;
            iVar12 = auVar25._4_4_;
            if ((bool)(~(auVar31._4_4_ == iVar12 && auVar25._0_4_ < auVar31._0_4_ ||
                        iVar12 < auVar31._4_4_) & 1)) {
              *(undefined4 *)((long)local_e8.data + uVar20 * 4) = 0xff7fffff;
            }
            if ((auVar31._12_4_ != auVar25._12_4_ || auVar31._8_4_ <= auVar25._8_4_) &&
                auVar31._12_4_ <= auVar25._12_4_) {
              *(undefined4 *)((long)local_e8.data + uVar20 * 4 + 4) = 0xff7fffff;
            }
            auVar31 = (auVar28 | auVar7) ^ auVar6;
            iVar22 = auVar31._4_4_;
            if (iVar22 <= iVar12 && (iVar22 != iVar12 || auVar31._0_4_ <= auVar25._0_4_)) {
              *(undefined4 *)((long)local_e8.data + uVar20 * 4 + 8) = 0xff7fffff;
              *(undefined4 *)((long)local_e8.data + uVar20 * 4 + 0xc) = 0xff7fffff;
            }
            uVar20 = uVar20 + 4;
          } while ((uVar13 + 3 & 0xfffffffc) != uVar20);
        }
        if (0 < (int)uVar19) {
          pvVar14 = bottom_top_blob->data;
          iVar12 = bottom_top_blob->w;
          sVar3 = bottom_top_blob->elemsize;
          uVar20 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar21 = 0;
              do {
                fVar27 = *(float *)((long)pvVar14 + uVar21 * 4);
                fVar24 = *(float *)((long)local_e8.data + uVar21 * 4);
                if (fVar27 <= fVar24) {
                  fVar27 = fVar24;
                }
                *(float *)((long)local_e8.data + uVar21 * 4) = fVar27;
                uVar21 = uVar21 + 1;
              } while (uVar15 != uVar21);
            }
            uVar20 = uVar20 + 1;
            pvVar14 = (void *)((long)pvVar14 + (long)iVar12 * sVar3);
          } while (uVar20 != uVar11);
        }
        local_98.cstep = 0;
        local_98.data = (void *)0x0;
        local_98.refcount._0_4_ = 0;
        local_98.refcount._4_4_ = 0;
        local_98.elemsize = 0;
        local_98.elempack = 0;
        local_98.allocator = (Allocator *)0x0;
        local_98.dims = 0;
        local_98.w = 0;
        local_98.h = 0;
        local_98.d = 0;
        local_98.c = 0;
        Mat::create(&local_98,uVar1,sVar2,opt->workspace_allocator);
        pvVar14 = local_98.data;
        iVar22 = -100;
        if ((local_98.data != (void *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
          uVar13 = (int)local_98.cstep * local_98.c;
          if (0 < (int)uVar13) {
            memset(local_98.data,0,(ulong)uVar13 << 2);
          }
          pvVar10 = local_e8.data;
          if (0 < (int)uVar19) {
            pvVar17 = bottom_top_blob->data;
            iVar12 = bottom_top_blob->w;
            sVar2 = bottom_top_blob->elemsize;
            uVar20 = 0;
            do {
              if (0 < (int)uVar1) {
                uVar21 = 0;
                do {
                  fVar24 = expf(*(float *)((long)pvVar17 + uVar21 * 4) -
                                *(float *)((long)pvVar10 + uVar21 * 4));
                  *(float *)((long)pvVar17 + uVar21 * 4) = fVar24;
                  *(float *)((long)pvVar14 + uVar21 * 4) =
                       fVar24 + *(float *)((long)pvVar14 + uVar21 * 4);
                  uVar21 = uVar21 + 1;
                } while (uVar15 != uVar21);
              }
              uVar20 = uVar20 + 1;
              pvVar17 = (void *)((long)pvVar17 + (long)iVar12 * sVar2);
            } while (uVar20 != uVar11);
            if (0 < (int)uVar19) {
              pvVar10 = bottom_top_blob->data;
              iVar12 = bottom_top_blob->w;
              sVar2 = bottom_top_blob->elemsize;
              uVar20 = 0;
              do {
                if (0 < (int)uVar1) {
                  uVar21 = 0;
                  do {
                    *(float *)((long)pvVar10 + uVar21 * 4) =
                         *(float *)((long)pvVar10 + uVar21 * 4) /
                         *(float *)((long)pvVar14 + uVar21 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar15 != uVar21);
                }
                uVar20 = uVar20 + 1;
                pvVar10 = (void *)((long)pvVar10 + (long)iVar12 * sVar2);
              } while (uVar20 != uVar11);
            }
          }
          iVar22 = 0;
        }
        piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_98.allocator == (Allocator *)0x0) {
              if (local_98.data != (void *)0x0) {
                free(local_98.data);
              }
            }
            else {
              (*(local_98.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar5 == (int *)0x0) {
        return iVar22;
      }
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 != 0) {
        return iVar22;
      }
      if (local_e8.allocator != (Allocator *)0x0) {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
        return iVar22;
      }
    }
    else {
      if ((uVar1 == 2) && (iVar12 == 1)) {
        iVar12 = bottom_top_blob->h;
        if (0 < (long)iVar12) {
          uVar1 = bottom_top_blob->w;
          uVar15 = (ulong)uVar1;
          pvVar14 = bottom_top_blob->data;
          lVar16 = 0;
          do {
            if (0 < (int)uVar1) {
              uVar11 = 0;
              fVar24 = -3.4028235e+38;
              do {
                fVar27 = *(float *)((long)pvVar14 + uVar11 * 4);
                if (fVar24 <= fVar27) {
                  fVar24 = fVar27;
                }
                uVar11 = uVar11 + 1;
              } while (uVar15 != uVar11);
              if (0 < (int)uVar1) {
                fVar27 = 0.0;
                uVar11 = 0;
                do {
                  fVar23 = expf(*(float *)((long)pvVar14 + uVar11 * 4) - fVar24);
                  *(float *)((long)pvVar14 + uVar11 * 4) = fVar23;
                  fVar27 = fVar27 + fVar23;
                  uVar11 = uVar11 + 1;
                } while (uVar15 != uVar11);
                if (0 < (int)uVar1) {
                  uVar11 = 0;
                  do {
                    *(float *)((long)pvVar14 + uVar11 * 4) =
                         *(float *)((long)pvVar14 + uVar11 * 4) * (1.0 / fVar27);
                    uVar11 = uVar11 + 1;
                  } while (uVar15 != uVar11);
                }
              }
            }
            lVar16 = lVar16 + 1;
            pvVar14 = (void *)((long)pvVar14 + sVar2 * (long)(int)uVar1);
          } while (lVar16 != iVar12);
        }
        goto LAB_00211fa7;
      }
      if ((uVar1 == 3) && (iVar12 == 0)) {
        iVar12 = bottom_top_blob->w;
        iVar18 = bottom_top_blob->h;
        uVar1 = bottom_top_blob->c;
        uVar15 = (ulong)uVar1;
        local_e8.cstep = 0;
        local_e8.data = (void *)0x0;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize = 0;
        local_e8.elempack = 0;
        local_e8.allocator = (Allocator *)0x0;
        local_e8.dims = 0;
        local_e8.w = 0;
        local_e8.h = 0;
        local_e8.d = 0;
        local_e8.c = 0;
        Mat::create(&local_e8,iVar12,iVar18,sVar2,opt->workspace_allocator);
        auVar8 = _DAT_00312280;
        auVar7 = _DAT_00312270;
        auVar6 = _DAT_00312200;
        iVar22 = -100;
        if ((local_e8.data != (void *)0x0) && (local_e8.cstep * (long)local_e8.c != 0)) {
          uVar19 = (int)local_e8.cstep * local_e8.c;
          if (0 < (int)uVar19) {
            lVar16 = (ulong)uVar19 - 1;
            auVar26._8_4_ = (int)lVar16;
            auVar26._0_8_ = lVar16;
            auVar26._12_4_ = (int)((ulong)lVar16 >> 0x20);
            uVar11 = 0;
            auVar26 = auVar26 ^ _DAT_00312200;
            do {
              auVar29._8_4_ = (int)uVar11;
              auVar29._0_8_ = uVar11;
              auVar29._12_4_ = (int)(uVar11 >> 0x20);
              auVar31 = (auVar29 | auVar8) ^ auVar6;
              iVar22 = auVar26._4_4_;
              if ((bool)(~(auVar31._4_4_ == iVar22 && auVar26._0_4_ < auVar31._0_4_ ||
                          iVar22 < auVar31._4_4_) & 1)) {
                *(undefined4 *)((long)local_e8.data + uVar11 * 4) = 0xff7fffff;
              }
              if ((auVar31._12_4_ != auVar26._12_4_ || auVar31._8_4_ <= auVar26._8_4_) &&
                  auVar31._12_4_ <= auVar26._12_4_) {
                *(undefined4 *)((long)local_e8.data + uVar11 * 4 + 4) = 0xff7fffff;
              }
              auVar31 = (auVar29 | auVar7) ^ auVar6;
              iVar32 = auVar31._4_4_;
              if (iVar32 <= iVar22 && (iVar32 != iVar22 || auVar31._0_4_ <= auVar26._0_4_)) {
                *(undefined4 *)((long)local_e8.data + uVar11 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)local_e8.data + uVar11 * 4 + 0xc) = 0xff7fffff;
              }
              uVar11 = uVar11 + 4;
            } while ((uVar19 + 3 & 0xfffffffc) != uVar11);
          }
          uVar19 = iVar18 * iVar12;
          if (0 < (int)uVar1) {
            sVar3 = bottom_top_blob->cstep;
            sVar4 = bottom_top_blob->elemsize;
            pvVar14 = bottom_top_blob->data;
            uVar11 = 0;
            do {
              if (0 < (int)uVar19) {
                uVar20 = 0;
                do {
                  fVar27 = *(float *)((long)pvVar14 + uVar20 * 4);
                  fVar24 = *(float *)((long)local_e8.data + uVar20 * 4);
                  if (fVar27 <= fVar24) {
                    fVar27 = fVar24;
                  }
                  *(float *)((long)local_e8.data + uVar20 * 4) = fVar27;
                  uVar20 = uVar20 + 1;
                } while (uVar19 != uVar20);
              }
              uVar11 = uVar11 + 1;
              pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
            } while (uVar11 != uVar15);
          }
          local_98.cstep = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize = 0;
          local_98.elempack = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.d = 0;
          local_98.c = 0;
          Mat::create(&local_98,iVar12,iVar18,sVar2,opt->workspace_allocator);
          iVar22 = -100;
          if ((local_98.data != (void *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
            uVar13 = (int)local_98.cstep * local_98.c;
            if (0 < (int)uVar13) {
              memset(local_98.data,0,(ulong)uVar13 << 2);
            }
            pvVar10 = local_98.data;
            pvVar14 = local_e8.data;
            if (0 < (int)uVar1) {
              pvVar17 = bottom_top_blob->data;
              sVar2 = bottom_top_blob->cstep;
              sVar3 = bottom_top_blob->elemsize;
              uVar11 = 0;
              do {
                if (0 < (int)uVar19) {
                  uVar20 = 0;
                  do {
                    fVar24 = expf(*(float *)((long)pvVar17 + uVar20 * 4) -
                                  *(float *)((long)pvVar14 + uVar20 * 4));
                    *(float *)((long)pvVar17 + uVar20 * 4) = fVar24;
                    *(float *)((long)pvVar10 + uVar20 * 4) =
                         fVar24 + *(float *)((long)pvVar10 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar19 != uVar20);
                }
                uVar11 = uVar11 + 1;
                pvVar17 = (void *)((long)pvVar17 + sVar2 * sVar3);
              } while (uVar11 != uVar15);
              if (0 < (int)uVar1) {
                pvVar14 = bottom_top_blob->data;
                sVar2 = bottom_top_blob->cstep;
                sVar3 = bottom_top_blob->elemsize;
                uVar11 = 0;
                do {
                  if (0 < (int)uVar19) {
                    uVar20 = 0;
                    do {
                      *(float *)((long)pvVar14 + uVar20 * 4) =
                           *(float *)((long)pvVar14 + uVar20 * 4) /
                           *(float *)((long)local_98.data + uVar20 * 4);
                      uVar20 = uVar20 + 1;
                    } while (uVar19 != uVar20);
                  }
                  uVar11 = uVar11 + 1;
                  pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
                } while (uVar11 != uVar15);
              }
            }
            iVar22 = 0;
          }
          piVar5 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + -1;
            UNLOCK();
            if (*piVar5 == 0) {
              if (local_98.allocator == (Allocator *)0x0) {
                if (local_98.data != (void *)0x0) {
                  free(local_98.data);
                }
              }
              else {
                (*(local_98.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 == (int *)0x0) {
          return iVar22;
        }
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) {
          return iVar22;
        }
        if (local_e8.allocator != (Allocator *)0x0) {
          (*(local_e8.allocator)->_vptr_Allocator[3])();
          return iVar22;
        }
      }
      else {
        if ((uVar1 != 3) || (iVar12 != 1)) {
          if (uVar1 != 3) {
            return 0;
          }
          if (iVar12 != 2) {
            return 0;
          }
          iVar12 = bottom_top_blob->c;
          if ((long)iVar12 < 1) {
            return 0;
          }
          iVar22 = bottom_top_blob->h;
          uVar1 = bottom_top_blob->w;
          uVar15 = (ulong)uVar1;
          local_110 = bottom_top_blob->data;
          sVar3 = bottom_top_blob->cstep;
          lVar16 = 0;
          do {
            if (0 < iVar22) {
              iVar18 = 0;
              pvVar14 = local_110;
              do {
                if (0 < (int)uVar1) {
                  uVar11 = 0;
                  fVar24 = -3.4028235e+38;
                  do {
                    fVar27 = *(float *)((long)pvVar14 + uVar11 * 4);
                    if (fVar24 <= fVar27) {
                      fVar24 = fVar27;
                    }
                    uVar11 = uVar11 + 1;
                  } while (uVar15 != uVar11);
                  if (0 < (int)uVar1) {
                    fVar27 = 0.0;
                    uVar11 = 0;
                    do {
                      fVar23 = expf(*(float *)((long)pvVar14 + uVar11 * 4) - fVar24);
                      *(float *)((long)pvVar14 + uVar11 * 4) = fVar23;
                      fVar27 = fVar27 + fVar23;
                      uVar11 = uVar11 + 1;
                    } while (uVar15 != uVar11);
                    if (0 < (int)uVar1) {
                      uVar11 = 0;
                      do {
                        *(float *)((long)pvVar14 + uVar11 * 4) =
                             *(float *)((long)pvVar14 + uVar11 * 4) * (1.0 / fVar27);
                        uVar11 = uVar11 + 1;
                      } while (uVar15 != uVar11);
                    }
                  }
                }
                iVar18 = iVar18 + 1;
                pvVar14 = (void *)((long)pvVar14 + (long)(int)uVar1 * 4);
              } while (iVar18 != iVar22);
            }
            lVar16 = lVar16 + 1;
            local_110 = (void *)((long)local_110 + sVar2 * sVar3);
          } while (lVar16 != iVar12);
          return 0;
        }
        uVar1 = bottom_top_blob->w;
        uVar11 = (ulong)uVar1;
        iVar12 = bottom_top_blob->h;
        uVar19 = bottom_top_blob->c;
        uVar15 = (ulong)uVar19;
        local_e8.cstep = 0;
        local_e8.data = (void *)0x0;
        local_e8.refcount._0_4_ = 0;
        local_e8.refcount._4_4_ = 0;
        local_e8.elemsize = 0;
        local_e8.elempack = 0;
        local_e8.allocator = (Allocator *)0x0;
        local_e8.dims = 0;
        local_e8.w = 0;
        local_e8.h = 0;
        local_e8.d = 0;
        local_e8.c = 0;
        Mat::create(&local_e8,uVar1,uVar19,sVar2,opt->workspace_allocator);
        auVar8 = _DAT_00312280;
        auVar7 = _DAT_00312270;
        auVar6 = _DAT_00312200;
        iVar22 = -100;
        if ((local_e8.data != (void *)0x0) && (local_e8.cstep * (long)local_e8.c != 0)) {
          uVar13 = (int)local_e8.cstep * local_e8.c;
          if (0 < (int)uVar13) {
            lVar16 = (ulong)uVar13 - 1;
            auVar31._8_4_ = (int)lVar16;
            auVar31._0_8_ = lVar16;
            auVar31._12_4_ = (int)((ulong)lVar16 >> 0x20);
            uVar20 = 0;
            auVar31 = auVar31 ^ _DAT_00312200;
            do {
              auVar30._8_4_ = (int)uVar20;
              auVar30._0_8_ = uVar20;
              auVar30._12_4_ = (int)(uVar20 >> 0x20);
              auVar26 = (auVar30 | auVar8) ^ auVar6;
              iVar22 = auVar31._4_4_;
              if ((bool)(~(auVar26._4_4_ == iVar22 && auVar31._0_4_ < auVar26._0_4_ ||
                          iVar22 < auVar26._4_4_) & 1)) {
                *(undefined4 *)((long)local_e8.data + uVar20 * 4) = 0xff7fffff;
              }
              if ((auVar26._12_4_ != auVar31._12_4_ || auVar26._8_4_ <= auVar31._8_4_) &&
                  auVar26._12_4_ <= auVar31._12_4_) {
                *(undefined4 *)((long)local_e8.data + uVar20 * 4 + 4) = 0xff7fffff;
              }
              auVar30 = (auVar30 | auVar7) ^ auVar6;
              iVar18 = auVar30._4_4_;
              if (iVar18 <= iVar22 && (iVar18 != iVar22 || auVar30._0_4_ <= auVar31._0_4_)) {
                *(undefined4 *)((long)local_e8.data + uVar20 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)local_e8.data + uVar20 * 4 + 0xc) = 0xff7fffff;
              }
              uVar20 = uVar20 + 4;
            } while ((uVar13 + 3 & 0xfffffffc) != uVar20);
          }
          if (0 < (int)uVar19) {
            pvVar14 = bottom_top_blob->data;
            sVar3 = bottom_top_blob->cstep;
            sVar4 = bottom_top_blob->elemsize;
            uVar20 = 0;
            pvVar10 = local_e8.data;
            do {
              if (0 < iVar12) {
                iVar22 = 0;
                pvVar17 = pvVar14;
                do {
                  if (0 < (int)uVar1) {
                    uVar21 = 0;
                    do {
                      fVar27 = *(float *)((long)pvVar17 + uVar21 * 4);
                      fVar24 = *(float *)((long)pvVar10 + uVar21 * 4);
                      if (fVar27 <= fVar24) {
                        fVar27 = fVar24;
                      }
                      *(float *)((long)pvVar10 + uVar21 * 4) = fVar27;
                      uVar21 = uVar21 + 1;
                    } while (uVar11 != uVar21);
                  }
                  iVar22 = iVar22 + 1;
                  pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar1 * 4);
                } while (iVar22 != iVar12);
              }
              uVar20 = uVar20 + 1;
              pvVar14 = (void *)((long)pvVar14 + sVar3 * sVar4);
              pvVar10 = (void *)((long)pvVar10 + (long)local_e8.w * local_e8.elemsize);
            } while (uVar20 != uVar15);
          }
          local_98.cstep = 0;
          local_98.data = (void *)0x0;
          local_98.refcount._0_4_ = 0;
          local_98.refcount._4_4_ = 0;
          local_98.elemsize = 0;
          local_98.elempack = 0;
          local_98.allocator = (Allocator *)0x0;
          local_98.dims = 0;
          local_98.w = 0;
          local_98.h = 0;
          local_98.d = 0;
          local_98.c = 0;
          Mat::create(&local_98,uVar1,uVar19,sVar2,opt->workspace_allocator);
          pvVar14 = local_98.data;
          iVar22 = -100;
          if ((local_98.data != (void *)0x0) && (local_98.cstep * (long)local_98.c != 0)) {
            uVar13 = (int)local_98.cstep * local_98.c;
            if (0 < (int)uVar13) {
              memset(local_98.data,0,(ulong)uVar13 << 2);
            }
            if (0 < (int)uVar19) {
              local_108 = bottom_top_blob->data;
              local_48 = (long)local_98.w * local_98.elemsize;
              local_40 = (long)local_e8.w * local_e8.elemsize;
              local_38 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
              lVar16 = (long)(int)uVar1 * 4;
              uVar20 = 0;
              local_50 = pvVar14;
              pvVar10 = local_e8.data;
              do {
                if (0 < iVar12) {
                  iVar22 = 0;
                  pvVar17 = local_108;
                  do {
                    if (0 < (int)uVar1) {
                      uVar21 = 0;
                      do {
                        fVar24 = expf(*(float *)((long)pvVar17 + uVar21 * 4) -
                                      *(float *)((long)pvVar10 + uVar21 * 4));
                        *(float *)((long)pvVar17 + uVar21 * 4) = fVar24;
                        *(float *)((long)pvVar14 + uVar21 * 4) =
                             fVar24 + *(float *)((long)pvVar14 + uVar21 * 4);
                        uVar21 = uVar21 + 1;
                      } while (uVar11 != uVar21);
                    }
                    iVar22 = iVar22 + 1;
                    pvVar17 = (void *)((long)pvVar17 + lVar16);
                  } while (iVar22 != iVar12);
                }
                uVar20 = uVar20 + 1;
                pvVar14 = (void *)((long)pvVar14 + local_48);
                pvVar10 = (void *)((long)pvVar10 + local_40);
                local_108 = (void *)((long)local_108 + local_38);
              } while (uVar20 != uVar15);
              if (0 < (int)uVar19) {
                pvVar14 = bottom_top_blob->data;
                sVar2 = bottom_top_blob->cstep;
                sVar3 = bottom_top_blob->elemsize;
                uVar20 = 0;
                pvVar10 = local_50;
                do {
                  if (0 < iVar12) {
                    iVar22 = 0;
                    pvVar17 = pvVar14;
                    do {
                      if (0 < (int)uVar1) {
                        uVar21 = 0;
                        do {
                          *(float *)((long)pvVar17 + uVar21 * 4) =
                               *(float *)((long)pvVar17 + uVar21 * 4) /
                               *(float *)((long)pvVar10 + uVar21 * 4);
                          uVar21 = uVar21 + 1;
                        } while (uVar11 != uVar21);
                      }
                      iVar22 = iVar22 + 1;
                      pvVar17 = (void *)((long)pvVar17 + lVar16);
                    } while (iVar22 != iVar12);
                  }
                  uVar20 = uVar20 + 1;
                  pvVar14 = (void *)((long)pvVar14 + sVar2 * sVar3);
                  pvVar10 = (void *)((long)pvVar10 + (long)local_98.w * local_98.elemsize);
                } while (uVar20 != uVar15);
              }
            }
            iVar22 = 0;
          }
          Mat::~Mat(&local_98);
        }
        piVar5 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
        if (piVar5 == (int *)0x0) {
          return iVar22;
        }
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 != 0) {
          return iVar22;
        }
        if (local_e8.allocator != (Allocator *)0x0) {
          (*(local_e8.allocator)->_vptr_Allocator[3])();
          return iVar22;
        }
      }
    }
    if (local_e8.data != (void *)0x0) {
      free(local_e8.data);
    }
  }
  return iVar22;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i = 0; i < w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i = 0; i < w; i++)
        {
            ptr[i] = static_cast<float>(exp(ptr[i] - max));
            sum += ptr[i];
        }

        for (int i = 0; i < w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i = 0; i < h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - max[j]));
                sum[j] += ptr[j];
            }
        }

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j = 0; j < w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j = 0; j < w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j = 0; j < w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - m));
                s += ptr[j];
            }

            for (int j = 0; j < w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = static_cast<float>(exp(ptr[i] - max[i]));
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - maxptr[j]));
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                float max = -FLT_MAX;
                for (int j = 0; j < w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}